

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  section *psVar1;
  undefined8 local_90;
  allocator<char> local_81;
  string local_80;
  section *local_60;
  section *shstrtab;
  allocator<char> local_41;
  string local_40 [38];
  undefined2 local_1a;
  section *local_18;
  section *sec0;
  elfio *this_local;
  
  sec0 = (section *)this;
  local_18 = create_section(this);
  local_1a = 0;
  (*local_18->_vptr_section[0x23])(local_18,&local_1a);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  (*psVar1->_vptr_section[4])(psVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  shstrtab._0_4_ = 0;
  (*local_18->_vptr_section[0x16])(local_18,&shstrtab);
  set_section_name_str_index(this,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,".shstrtab",&local_81);
  psVar1 = Sections::add(&this->sections,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_60 = psVar1;
  (*psVar1->_vptr_section[6])(psVar1,&SHT_STRTAB);
  local_90 = 1;
  (*local_60->_vptr_section[0xe])(local_60,&local_90);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }